

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O3

shared_ptr<Variable> __thiscall Builder::getvarbyname(Builder *this,string *name)

{
  size_type sVar1;
  pointer pcVar2;
  iterator iVar3;
  Variable *__p;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<Variable> sVar5;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>
  local_60;
  
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)name,in_RDX);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    __p = (Variable *)operator_new(0x38);
    pcVar2 = (in_RDX->_M_dataplus)._M_p;
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar2,pcVar2 + in_RDX->_M_string_length);
    __p->type = CONTINUOUS;
    *(undefined4 *)&__p->lowerbound = 0;
    *(undefined4 *)((long)&__p->lowerbound + 4) = 0;
    *(undefined4 *)&__p->upperbound = 0;
    *(undefined4 *)((long)&__p->upperbound + 4) = 0x7ff00000;
    (__p->name)._M_dataplus._M_p = (pointer)&(__p->name).field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&__p->name,local_80,local_80 + local_78);
    (this->variables)._M_h._M_buckets = (__buckets_ptr)__p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Variable*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->variables)._M_h._M_bucket_count
               ,__p);
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>
    ::pair<std::shared_ptr<Variable>_&,_true>(&local_60,in_RDX,(shared_ptr<Variable> *)this);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Variable>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Variable>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<Variable>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Variable>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Variable>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)name,&local_60);
    if (local_60.second.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.second.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
      operator_delete(local_60.first._M_dataplus._M_p);
    }
    std::vector<std::shared_ptr<Variable>,_std::allocator<std::shared_ptr<Variable>_>_>::push_back
              ((vector<std::shared_ptr<Variable>,_std::allocator<std::shared_ptr<Variable>_>_> *)
               &name[3]._M_string_length,(value_type *)this);
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    (this->variables)._M_h._M_buckets =
         *(__buckets_ptr *)
          ((long)iVar3.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>,_true>
                 ._M_cur + 0x28);
    sVar1 = *(size_type *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>,_true>
                    ._M_cur + 0x30);
    (this->variables)._M_h._M_bucket_count = sVar1;
    _Var4._M_pi = extraout_RDX;
    if (sVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
      }
    }
  }
  sVar5.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Variable>)sVar5.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Variable> getvarbyname(const std::string& name) {
    auto it = variables.find(name);
    if (it != variables.end()) return it->second;
    auto newvar = std::shared_ptr<Variable>(new Variable(name));
    variables.insert(std::make_pair(name, newvar));
    model.variables.push_back(newvar);
    return newvar;
  }